

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O0

QUrl __thiscall QFileDialog::directoryUrl(QFileDialog *this)

{
  QFileDialogPrivate *pQVar1;
  QFileDialogPrivate *in_RSI;
  QUrlPrivate *in_RDI;
  long in_FS_OFFSET;
  QFileDialogPrivate *d;
  QFileDialogPrivate *this_00;
  QDir local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RSI;
  pQVar1 = d_func((QFileDialog *)0x75520b);
  if (((pQVar1->super_QDialogPrivate).nativeDialogInUse & 1U) == 0) {
    directory((QFileDialog *)this_00);
    QDir::absolutePath();
    QUrl::fromLocalFile((QString *)in_RDI);
    QString::~QString((QString *)0x755264);
    QDir::~QDir(local_28);
  }
  else {
    QFileDialogPrivate::directory_sys(in_RSI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QUrl)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QUrl QFileDialog::directoryUrl() const
{
    Q_D(const QFileDialog);
    if (d->nativeDialogInUse)
        return d->directory_sys();
    else
        return QUrl::fromLocalFile(directory().absolutePath());
}